

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O2

char * base64(void *binaryData,int len,int *flen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  char cVar9;
  long lVar10;
  
  bVar4 = (byte)((long)len % 3);
  iVar5 = (int)(((uint)(byte)((bVar4 & 2) >> 1 | bVar4 * '\x02' & 3) + len) * 4) / 3;
  *flen = iVar5;
  pcVar6 = (char *)malloc((long)(iVar5 + 1));
  if (pcVar6 == (char *)0x0) {
    puts("ERROR: base64 could not allocate enough memory.");
    puts("I must stop because I could not get enough");
    return (char *)0x0;
  }
  lVar7 = 0;
  for (lVar10 = 0; lVar10 <= len + -3; lVar10 = lVar10 + 3) {
    bVar1 = *(byte *)((long)binaryData + lVar10);
    bVar2 = *(byte *)((long)binaryData + lVar10 + 1);
    bVar3 = *(byte *)((long)binaryData + lVar10 + 2);
    pcVar6[lVar7] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
    pcVar6[lVar7 + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
    pcVar6[lVar7 + 2] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)(bVar3 >> 6) + (bVar2 & 0xf) * 4];
    pcVar6[lVar7 + 3] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 & 0x3f];
    lVar7 = lVar7 + 4;
  }
  if ((bVar4 & 3) == 1) {
    bVar4 = *(byte *)((long)binaryData + lVar10);
    pcVar6[lVar7] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar4 >> 2];
    pcVar6[lVar7 + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(bVar4 & 3) << 4];
    cVar9 = '=';
  }
  else {
    lVar8 = lVar7;
    if (((uint)((long)len % 3) & 3) != 2) goto LAB_001ed5f1;
    bVar4 = *(byte *)((long)binaryData + lVar10);
    pcVar6[lVar7] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar4 >> 2];
    bVar1 = *(byte *)((long)binaryData + lVar10 + 1);
    pcVar6[lVar7 + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)(bVar1 >> 4) | (bVar4 & 3) << 4];
    cVar9 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
            [(ulong)(bVar1 & 0xf) * 4];
  }
  pcVar6[lVar7 + 2] = cVar9;
  lVar8 = lVar7 + 4;
  pcVar6[lVar7 + 3] = '=';
LAB_001ed5f1:
  pcVar6[(int)lVar8] = '\0';
  return pcVar6;
}

Assistant:

char* base64(const void* binaryData, int len, int *flen) {
	const unsigned char* bin = (const unsigned char*) binaryData;
	char* res;

	int rc = 0; // result counter
	int byteNo; // I need this after the loop

	int modulusLen = len % 3;
	int pad = ((modulusLen & 1) << 1) + ((modulusLen & 2) >> 1); // 2 gives 1 and 1 gives 2, but 0 gives 0.

	*flen = 4 * (len + pad) / 3;
	res = (char*) malloc(*flen + 1); // and one for the null
	if (!res) {
		puts("ERROR: base64 could not allocate enough memory.");
		puts("I must stop because I could not get enough");
		return 0;
	}

	for (byteNo = 0; byteNo <= len - 3; byteNo += 3) {
		unsigned char BYTE0 = bin[byteNo];
		unsigned char BYTE1 = bin[byteNo + 1];
		unsigned char BYTE2 = bin[byteNo + 2];
		res[rc++] = b64[BYTE0 >> 2];
		res[rc++] = b64[((0x3 & BYTE0) << 4) + (BYTE1 >> 4)];
		res[rc++] = b64[((0x0f & BYTE1) << 2) + (BYTE2 >> 6)];
		res[rc++] = b64[0x3f & BYTE2];
	}

	if (pad == 2) {
		res[rc++] = b64[bin[byteNo] >> 2];
		res[rc++] = b64[(0x3 & bin[byteNo]) << 4];
		res[rc++] = '=';
		res[rc++] = '=';
	} else if (pad == 1) {
		res[rc++] = b64[bin[byteNo] >> 2];
		res[rc++] = b64[((0x3 & bin[byteNo]) << 4) + (bin[byteNo + 1] >> 4)];
		res[rc++] = b64[(0x0f & bin[byteNo + 1]) << 2];
		res[rc++] = '=';
	}

	res[rc] = 0; // NULL TERMINATOR! ;)
	return res;
}